

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O1

void ssh_shutdown(Ssh *ssh)

{
  Socket *pSVar1;
  
  ssh_shutdown_internal(ssh);
  if (ssh->bpp != (BinaryPacketProtocol *)0x0) {
    ssh_bpp_free(ssh->bpp);
    ssh->bpp = (BinaryPacketProtocol *)0x0;
  }
  pSVar1 = ssh->s;
  if (pSVar1 != (Socket *)0x0) {
    (*pSVar1->vt->close)(pSVar1);
    ssh->s = (Socket *)0x0;
    (*ssh->seat->vt->notify_remote_disconnect)(ssh->seat);
  }
  bufchain_clear(&ssh->in_raw);
  bufchain_clear(&ssh->out_raw);
  bufchain_clear(&ssh->user_input);
  return;
}

Assistant:

static void ssh_shutdown(Ssh *ssh)
{
    ssh_shutdown_internal(ssh);

    if (ssh->bpp) {
        ssh_bpp_free(ssh->bpp);
        ssh->bpp = NULL;
    }

    if (ssh->s) {
        sk_close(ssh->s);
        ssh->s = NULL;
        seat_notify_remote_disconnect(ssh->seat);
    }

    bufchain_clear(&ssh->in_raw);
    bufchain_clear(&ssh->out_raw);
    bufchain_clear(&ssh->user_input);
}